

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O1

void add_pax_attr_int(archive_string *as,char *key,int64_t value)

{
  bool bVar1;
  char *pcVar2;
  char *value_00;
  ulong uVar3;
  char tmp [25];
  char local_12 [10];
  
  local_12[2] = 0;
  pcVar2 = local_12 + 1;
  uVar3 = -value;
  if (0 < value) {
    uVar3 = value;
  }
  do {
    value_00 = pcVar2;
    *value_00 = "_abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789"[uVar3 % 10 + 0x35]
    ;
    pcVar2 = value_00 + -1;
    bVar1 = 9 < uVar3;
    uVar3 = uVar3 / 10;
  } while (bVar1);
  if (value < 0) {
    *pcVar2 = '-';
    value_00 = pcVar2;
  }
  add_pax_attr(as,key,value_00);
  return;
}

Assistant:

static void
add_pax_attr_int(struct archive_string *as, const char *key, int64_t value)
{
	char tmp[1 + 3 * sizeof(value)];

	tmp[sizeof(tmp) - 1] = 0;
	add_pax_attr(as, key, format_int(tmp + sizeof(tmp) - 1, value));
}